

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestExceptionsInFixtureAreReportedAsHappeningInTheFixture::
TestExceptionsInFixtureAreReportedAsHappeningInTheFixture
          (TestExceptionsInFixtureAreReportedAsHappeningInTheFixture *this)

{
  char *suiteName;
  TestExceptionsInFixtureAreReportedAsHappeningInTheFixture *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"ExceptionsInFixtureAreReportedAsHappeningInTheFixture",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestTestMacros.cpp"
             ,0x29);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestExceptionsInFixtureAreReportedAsHappeningInTheFixture_00184900;
  return;
}

Assistant:

TEST (ExceptionsInFixtureAreReportedAsHappeningInTheFixture)
{
    RecordingReporter reporter;
    TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResults(result);
		list2.GetHead()->Run();
	}

    CHECK(strstr(reporter.lastFailedMessage, "xception"));
    CHECK(strstr(reporter.lastFailedMessage, "fixture"));
    CHECK(strstr(reporter.lastFailedMessage, "ThrowingThingie"));
}